

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

HEADER_HANDLE header_create(void)

{
  HEADER_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (HEADER_HANDLE)malloc(8);
  if (__ptr != (HEADER_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x70);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (HEADER_HANDLE)0x0;
}

Assistant:

HEADER_HANDLE header_create(void)
{
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)malloc(sizeof(HEADER_INSTANCE));
    if (header_instance != NULL)
    {
        header_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(112);
        if (header_instance->composite_value == NULL)
        {
            free(header_instance);
            header_instance = NULL;
        }
    }

    return header_instance;
}